

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.cpp
# Opt level: O2

void SysFreeString(BSTR bstr)

{
  HANDLE hHeap;
  
  if (bstr != (BSTR)0x0) {
    hHeap = GetProcessHeap();
    HeapFree(hHeap,0,bstr + -4);
    return;
  }
  return;
}

Assistant:

SysFreeString(BSTR bstr)
{
    if (bstr != NULL)
    {
        bstr = (BSTR) ((char*) bstr - sizeof(DWORD));
#if defined(_WIN64)
        bstr = (BSTR) ((char*) bstr - sizeof(DWORD));
#endif
        HeapFree(GetProcessHeap(), 0, (LPVOID) bstr);
    }
}